

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dec_sse2.c
# Opt level: O0

void LD4_SSE2(uint8_t *dst,uint8_t *top)

{
  ulong uVar1;
  undefined1 auVar2 [16];
  ulong *in_RSI;
  undefined1 uVar3;
  undefined1 uVar5;
  undefined1 uVar6;
  undefined1 uVar7;
  undefined1 uVar8;
  undefined1 uVar9;
  undefined1 uVar10;
  undefined1 uVar11;
  undefined1 uVar12;
  undefined1 uVar13;
  undefined1 uVar14;
  undefined1 uVar15;
  undefined1 uVar16;
  undefined1 uVar17;
  undefined1 uVar18;
  undefined1 uVar19;
  undefined1 auVar4 [16];
  __m128i abcdefg;
  __m128i avg2;
  __m128i lsb;
  __m128i avg1;
  __m128i CDEFGHH0;
  __m128i CDEFGH00;
  __m128i BCDEFGH0;
  __m128i ABCDEFGH;
  __m128i one;
  undefined1 local_98;
  undefined1 uStack_97;
  undefined1 uStack_96;
  undefined1 uStack_95;
  undefined1 uStack_94;
  undefined1 uStack_93;
  undefined1 uStack_92;
  undefined1 uStack_91;
  undefined1 uStack_90;
  undefined1 uStack_8f;
  undefined1 uStack_8e;
  undefined1 uStack_8d;
  undefined1 uStack_8c;
  undefined1 uStack_8b;
  undefined1 uStack_8a;
  undefined1 uStack_89;
  undefined1 local_78;
  undefined1 uStack_77;
  undefined1 uStack_76;
  undefined1 uStack_75;
  undefined1 uStack_74;
  undefined1 uStack_73;
  undefined1 uStack_72;
  undefined1 uStack_71;
  
  uVar1 = *in_RSI;
  local_78 = (undefined1)uVar1;
  uStack_77 = (undefined1)(uVar1 >> 8);
  uStack_76 = (undefined1)(uVar1 >> 0x10);
  uStack_75 = (undefined1)(uVar1 >> 0x18);
  uStack_74 = (undefined1)(uVar1 >> 0x20);
  uStack_73 = (undefined1)(uVar1 >> 0x28);
  uStack_72 = (undefined1)(uVar1 >> 0x30);
  uStack_71 = (undefined1)(uVar1 >> 0x38);
  uVar3 = pavgb(local_78,uStack_76);
  uVar5 = pavgb(uStack_77,uStack_75);
  uVar6 = pavgb(uStack_76,uStack_74);
  uVar7 = pavgb(uStack_75,uStack_73);
  uVar8 = pavgb(uStack_74,uStack_72);
  uVar9 = pavgb(uStack_73,uStack_71);
  uVar10 = pavgb(uStack_72,*(byte *)((long)in_RSI + 7));
  uVar11 = pavgb(uStack_71,0);
  uVar12 = pavgb(0,0);
  uVar13 = pavgb(0,0);
  uVar14 = pavgb(0,0);
  uVar15 = pavgb(0,0);
  uVar16 = pavgb(0,0);
  uVar17 = pavgb(0,0);
  uVar18 = pavgb(0,0);
  uVar19 = pavgb(0,0);
  auVar2[1] = uVar5;
  auVar2[0] = uVar3;
  auVar2[2] = uVar6;
  auVar2[3] = uVar7;
  auVar2[4] = uVar8;
  auVar2[5] = uVar9;
  auVar2[6] = uVar10;
  auVar2[7] = uVar11;
  auVar2[9] = uVar13;
  auVar2[8] = uVar12;
  auVar2[10] = uVar14;
  auVar2[0xb] = uVar15;
  auVar2[0xc] = uVar16;
  auVar2[0xd] = uVar17;
  auVar2[0xe] = uVar18;
  auVar2[0xf] = uVar19;
  auVar4._8_8_ = 0;
  auVar4._0_8_ = (uVar1 ^ (uVar1 >> 0x10 | (ulong)*(byte *)((long)in_RSI + 7) << 0x30)) &
                 0x101010101010101;
  auVar4 = psubusb(auVar2,auVar4);
  local_98 = auVar4[0];
  uStack_97 = auVar4[1];
  uStack_96 = auVar4[2];
  uStack_95 = auVar4[3];
  uStack_94 = auVar4[4];
  uStack_93 = auVar4[5];
  uStack_92 = auVar4[6];
  uStack_91 = auVar4[7];
  uStack_90 = auVar4[8];
  uStack_8f = auVar4[9];
  uStack_8e = auVar4[10];
  uStack_8d = auVar4[0xb];
  uStack_8c = auVar4[0xc];
  uStack_8b = auVar4[0xd];
  uStack_8a = auVar4[0xe];
  uStack_89 = auVar4[0xf];
  pavgb(local_98,uStack_77);
  pavgb(uStack_97,uStack_76);
  pavgb(uStack_96,uStack_75);
  pavgb(uStack_95,uStack_74);
  uVar3 = pavgb(uStack_94,uStack_73);
  uVar5 = pavgb(uStack_93,uStack_72);
  uVar6 = pavgb(uStack_92,uStack_71);
  uVar7 = pavgb(uStack_91,0);
  uVar8 = pavgb(uStack_90,0);
  uVar9 = pavgb(uStack_8f,0);
  uVar10 = pavgb(uStack_8e,0);
  uVar11 = pavgb(uStack_8d,0);
  uVar12 = pavgb(uStack_8c,0);
  uVar13 = pavgb(uStack_8b,0);
  uVar14 = pavgb(uStack_8a,0);
  uVar15 = pavgb(uStack_89,0);
  WebPInt32ToMem((uint8_t *)
                 CONCAT17(uVar15,CONCAT16(uVar14,CONCAT15(uVar13,CONCAT14(uVar12,CONCAT13(uVar11,
                                                  CONCAT12(uVar10,CONCAT11(uVar9,uVar8))))))),
                 CONCAT13(uVar7,CONCAT12(uVar6,CONCAT11(uVar5,uVar3))));
  WebPInt32ToMem((uint8_t *)
                 CONCAT17(uVar15,CONCAT16(uVar14,CONCAT15(uVar13,CONCAT14(uVar12,CONCAT13(uVar11,
                                                  CONCAT12(uVar10,CONCAT11(uVar9,uVar8))))))),
                 CONCAT13(uVar7,CONCAT12(uVar6,CONCAT11(uVar5,uVar3))));
  WebPInt32ToMem((uint8_t *)
                 CONCAT17(uVar15,CONCAT16(uVar14,CONCAT15(uVar13,CONCAT14(uVar12,CONCAT13(uVar11,
                                                  CONCAT12(uVar10,CONCAT11(uVar9,uVar8))))))),
                 CONCAT13(uVar7,CONCAT12(uVar6,CONCAT11(uVar5,uVar3))));
  WebPInt32ToMem((uint8_t *)
                 CONCAT17(uVar15,CONCAT16(uVar14,CONCAT15(uVar13,CONCAT14(uVar12,CONCAT13(uVar11,
                                                  CONCAT12(uVar10,CONCAT11(uVar9,uVar8))))))),
                 CONCAT13(uVar7,CONCAT12(uVar6,CONCAT11(uVar5,uVar3))));
  return;
}

Assistant:

static void LD4_SSE2(uint8_t* dst) {   // Down-Left
  const __m128i one = _mm_set1_epi8(1);
  const __m128i ABCDEFGH = _mm_loadl_epi64((__m128i*)(dst - BPS));
  const __m128i BCDEFGH0 = _mm_srli_si128(ABCDEFGH, 1);
  const __m128i CDEFGH00 = _mm_srli_si128(ABCDEFGH, 2);
  const __m128i CDEFGHH0 = _mm_insert_epi16(CDEFGH00, dst[-BPS + 7], 3);
  const __m128i avg1 = _mm_avg_epu8(ABCDEFGH, CDEFGHH0);
  const __m128i lsb = _mm_and_si128(_mm_xor_si128(ABCDEFGH, CDEFGHH0), one);
  const __m128i avg2 = _mm_subs_epu8(avg1, lsb);
  const __m128i abcdefg = _mm_avg_epu8(avg2, BCDEFGH0);
  WebPInt32ToMem(dst + 0 * BPS, _mm_cvtsi128_si32(               abcdefg    ));
  WebPInt32ToMem(dst + 1 * BPS, _mm_cvtsi128_si32(_mm_srli_si128(abcdefg, 1)));
  WebPInt32ToMem(dst + 2 * BPS, _mm_cvtsi128_si32(_mm_srli_si128(abcdefg, 2)));
  WebPInt32ToMem(dst + 3 * BPS, _mm_cvtsi128_si32(_mm_srli_si128(abcdefg, 3)));
}